

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O3

void __thiscall rcg::ImageList::removeOld(ImageList *this,uint64_t timestamp)

{
  pointer psVar1;
  pointer psVar2;
  ulong uVar3;
  
  psVar2 = (this->list).
           super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->list).
           super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 != psVar2) {
    uVar3 = 0;
    do {
      if (timestamp <
          (psVar2[uVar3].super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          timestamp) {
        uVar3 = uVar3 + 1;
      }
      else {
        std::
        vector<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
        ::_M_erase(&this->list,psVar2 + (int)uVar3);
        psVar2 = (this->list).
                 super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (this->list).
                 super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    } while (uVar3 < (ulong)((long)psVar1 - (long)psVar2 >> 4));
  }
  return;
}

Assistant:

void ImageList::removeOld(uint64_t timestamp)
{
  size_t i=0;

  while (i < list.size())
  {
    if (list[i]->getTimestampNS() <= timestamp)
    {
      list.erase(list.begin()+static_cast<int>(i));
    }
    else
    {
      i++;
    }
  }
}